

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaCom.c
# Opt level: O0

int Cba_CommandPut(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Cba_Man_t *p_00;
  Gia_Man_t *pNew;
  char *pcVar2;
  uint local_48;
  uint local_44;
  int fVerbose;
  int fSeq;
  int fBarBufs;
  int c;
  Gia_Man_t *pGia;
  Cba_Man_t *p;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  p_00 = Cba_AbcGetMan(pAbc);
  fVerbose = 1;
  local_44 = 0;
  local_48 = 0;
  Extra_UtilGetoptReset();
LAB_00441814:
  iVar1 = Extra_UtilGetopt(argc,argv,"bsvh");
  if (iVar1 == -1) {
    if (p_00 == (Cba_Man_t *)0x0) {
      Abc_Print(1,"Cba_CommandPut(): There is no current design.\n");
    }
    else {
      pNew = Cba_ManBlast(p_00,fVerbose,local_44,local_48);
      if (pNew == (Gia_Man_t *)0x0) {
        Abc_Print(1,"Cba_CommandPut(): Conversion to AIG has failed.\n");
      }
      else {
        Abc_FrameUpdateGia(pAbc,pNew);
      }
    }
    return 0;
  }
  switch(iVar1) {
  case 0x62:
    fVerbose = fVerbose ^ 1;
    goto LAB_00441814;
  default:
    break;
  case 0x68:
    break;
  case 0x73:
    local_44 = local_44 ^ 1;
    goto LAB_00441814;
  case 0x76:
    goto switchD_00441852_caseD_76;
  }
  Abc_Print(-2,"usage: :put [-bsvh]\n");
  Abc_Print(-2,"\t         extracts AIG from the hierarchical design\n");
  pcVar2 = "no";
  if (fVerbose != 0) {
    pcVar2 = "yes";
  }
  Abc_Print(-2,"\t-b     : toggle using barrier buffers [default = %s]\n",pcVar2);
  pcVar2 = "no";
  if (local_44 != 0) {
    pcVar2 = "yes";
  }
  Abc_Print(-2,"\t-s     : toggle blasting sequential elements [default = %s]\n",pcVar2);
  pcVar2 = "no";
  if (local_48 != 0) {
    pcVar2 = "yes";
  }
  Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar2);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  return 1;
switchD_00441852_caseD_76:
  local_48 = local_48 ^ 1;
  goto LAB_00441814;
}

Assistant:

int Cba_CommandPut( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Cba_Man_t * p = Cba_AbcGetMan(pAbc);
    Gia_Man_t * pGia = NULL;
    int c, fBarBufs = 1, fSeq = 0, fVerbose  = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "bsvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'b':
            fBarBufs ^= 1;
            break;
        case 's':
            fSeq ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( p == NULL )
    {
        Abc_Print( 1, "Cba_CommandPut(): There is no current design.\n" );
        return 0;
    }
    pGia = Cba_ManBlast( p, fBarBufs, fSeq, fVerbose );
    if ( pGia == NULL )
    {
        Abc_Print( 1, "Cba_CommandPut(): Conversion to AIG has failed.\n" );
        return 0;
    }
    Abc_FrameUpdateGia( pAbc, pGia );
    return 0;
usage:
    Abc_Print( -2, "usage: :put [-bsvh]\n" );
    Abc_Print( -2, "\t         extracts AIG from the hierarchical design\n" );
    Abc_Print( -2, "\t-b     : toggle using barrier buffers [default = %s]\n", fBarBufs? "yes": "no" );
    Abc_Print( -2, "\t-s     : toggle blasting sequential elements [default = %s]\n", fSeq? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}